

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

index_t __thiscall
GEO::Delaunay3dThread::stellate_conflict_zone_iterative
          (Delaunay3dThread *this,index_t v_in,index_t t1,index_t t1fbord,index_t t1fprev)

{
  pointer pFVar1;
  pointer pFVar2;
  bool bVar3;
  index_t iVar4;
  index_t iVar5;
  ulong uVar6;
  pointer piVar7;
  index_t t1fborder;
  index_t t2_in;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  index_t iVar11;
  index_t t2ft1;
  index_t t2;
  index_t t2fbord;
  uint local_48;
  index_t local_44;
  index_t local_40;
  index_t local_3c;
  StellateConflictStack *local_38;
  
  local_38 = &this->S2_;
  StellateConflictStack::push(local_38,t1,t1fbord,t1fprev);
  local_40 = v_in;
  do {
    iVar11 = local_40;
    pFVar1 = (this->S2_).store_.
             super__Vector_base<GEO::Delaunay3dThread::StellateConflictStack::Frame,_std::allocator<GEO::Delaunay3dThread::StellateConflictStack::Frame>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    t2_in = pFVar1[-1].t1;
    t1fborder = (index_t)pFVar1[-1].t1fbord;
    uVar10 = (uint)pFVar1[-1].t1fprev;
    uVar6 = (ulong)(t2_in * 4);
    piVar7 = (this->cell_to_v_store_->super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>).
             super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar4 = new_tetrahedron(this,piVar7[uVar6],piVar7[uVar6 + 1],piVar7[uVar6 + 2],piVar7[uVar6 + 3]
                           );
    uVar8 = t1fborder + iVar4 * 4;
    (this->cell_to_v_store_->super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>).
    super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
    super__Vector_impl_data._M_start[uVar8] = iVar11;
    piVar7 = (this->cell_to_cell_store_->super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>
             ).super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar11 = piVar7[t1fborder + t2_in * 4];
    piVar7[uVar8] = iVar11;
    iVar5 = find_tet_adjacent(this,iVar11,t2_in);
    piVar7 = (this->cell_to_cell_store_->super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>
             ).super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar7[iVar5 + iVar11 * 4] = iVar4;
    uVar8 = 0;
LAB_0018455d:
    if (3 < uVar8) {
      pFVar1 = (this->S2_).store_.
               super__Vector_base<GEO::Delaunay3dThread::StellateConflictStack::Frame,_std::allocator<GEO::Delaunay3dThread::StellateConflictStack::Frame>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pFVar2 = (this->S2_).store_.
               super__Vector_base<GEO::Delaunay3dThread::StellateConflictStack::Frame,_std::allocator<GEO::Delaunay3dThread::StellateConflictStack::Frame>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      (this->S2_).store_.
      super__Vector_base<GEO::Delaunay3dThread::StellateConflictStack::Frame,_std::allocator<GEO::Delaunay3dThread::StellateConflictStack::Frame>_>
      ._M_impl.super__Vector_impl_data._M_finish = pFVar2 + -1;
      if (pFVar1 == pFVar2 + -1) {
        return iVar4;
      }
      t2_in = pFVar2[-2].t1;
      iVar11 = pFVar2[-2].new_t;
      t1fborder = (index_t)pFVar2[-2].t1fbord;
      uVar10 = (uint)pFVar2[-2].t1fprev;
      uVar8 = (uint)pFVar2[-2].t1ft2;
      local_48 = (uint)pFVar2[-2].t2ft1;
      local_44 = iVar4;
LAB_001845b4:
      piVar7[local_48 + local_44 * 4] = iVar11;
      piVar7[iVar11 * 4 + uVar8] = local_44;
      uVar9 = uVar8;
      iVar4 = iVar11;
LAB_001845d1:
      uVar8 = uVar9 + 1;
      goto LAB_0018455d;
    }
    uVar9 = uVar10;
    if ((uVar8 == uVar10) || (uVar9 = uVar8, piVar7[uVar8 + iVar4 * 4] != -1)) goto LAB_001845d1;
    bVar3 = get_neighbor_along_conflict_zone_border
                      (this,t2_in,t1fborder,uVar8,&local_44,&local_3c,&local_48);
    if (bVar3) {
      piVar7 = (this->cell_to_cell_store_->
               super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>).
               super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar11 = iVar4;
      goto LAB_001845b4;
    }
    pFVar1 = (this->S2_).store_.
             super__Vector_base<GEO::Delaunay3dThread::StellateConflictStack::Frame,_std::allocator<GEO::Delaunay3dThread::StellateConflictStack::Frame>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pFVar1[-1].new_t = iVar4;
    pFVar1[-1].t1ft2 = (uint8)uVar8;
    pFVar1[-1].t2ft1 = (uint8)local_48;
    StellateConflictStack::push(local_38,local_44,local_3c,local_48);
  } while( true );
}

Assistant:

index_t stellate_conflict_zone_iterative(
            index_t v_in, index_t t1, index_t t1fbord,
            index_t t1fprev = index_t(-1)
        ) {
            //   This function is de-recursified because some degenerate
            // inputs can cause stack overflow (system stack is limited to
            // a few megs). For instance, it can happen when a large number
            // of points are on the same sphere exactly.
            
            //   To de-recursify, it uses class StellateConflictStack
            // that emulates system's stack for storing functions's
            // parameters and local variables in all the nested stack
            // frames. 
        
            signed_index_t v = signed_index_t(v_in);
            
            S2_.push(t1, t1fbord, t1fprev);
            
            index_t new_t;   // the newly created tetrahedron.
            
            index_t t1ft2;   // traverses the 4 facets of t1.
            
            index_t t2;      // the tetrahedron on the border of
                             // the conflict zone that shares an
                             // edge with t1 along t1ft2.
            
            index_t t2fbord; // the facet of t2 on the border of
                             // the conflict zone.
        
            index_t t2ft1;   // the facet of t2 that is incident to t1.
        
        entry_point:
            S2_.get_parameters(t1, t1fbord, t1fprev);


            geo_debug_assert(owns_tet(t1));
            geo_debug_assert(tet_adjacent(t1,t1fbord)>=0);
            geo_debug_assert(owns_tet(index_t(tet_adjacent(t1,t1fbord))));
            geo_debug_assert(tet_is_marked_as_conflict(t1));
            geo_debug_assert(
                !tet_is_marked_as_conflict(index_t(tet_adjacent(t1,t1fbord)))
            );

            // Create new tetrahedron with same vertices as t_bndry
            new_t = new_tetrahedron(
                tet_vertex(t1,0),
                tet_vertex(t1,1),
                tet_vertex(t1,2),
                tet_vertex(t1,3)
            );

            // Replace in new_t the vertex opposite to t1fbord with v
            set_tet_vertex(new_t, t1fbord, v);
            
            // Connect new_t with t1's neighbor accros t1fbord
            {
                index_t tbord = index_t(tet_adjacent(t1,t1fbord));
                set_tet_adjacent(new_t, t1fbord, tbord);
                set_tet_adjacent(tbord, find_tet_adjacent(tbord,t1), new_t);
            }
            
            //  Lookup new_t's neighbors accros its three other
            // facets and connect them
            for(t1ft2=0; t1ft2<4; ++t1ft2) {
                
                if(t1ft2 == t1fprev || tet_adjacent(new_t,t1ft2) != -1) {
                    continue;
                }
                
                // Get t1's neighbor along the border of the conflict zone
                if(!get_neighbor_along_conflict_zone_border(
                       t1,t1fbord,t1ft2, t2,t2fbord,t2ft1
                )) {
                    //   If t1's neighbor is not a new tetrahedron,
                    // create a new tetrahedron through a recursive call.
                    S2_.save_locals(new_t, t1ft2, t2ft1);
                    S2_.push(t2, t2fbord, t2ft1);
                    goto entry_point;

                return_point:
                    // This is the return value of the called function.
                    index_t result = new_t;
                    S2_.pop();
                    
                    // Special case: we were in the outermost frame, 
                    // then we (truly) return from the function.
                    if(S2_.empty()) {
                        return result;
                    }
                    
                    S2_.get_parameters(t1, t1fbord, t1fprev);
                    S2_.get_locals(new_t, t1ft2, t2ft1); 
                    t2 = result; 
                }
                
                set_tet_adjacent(t2, t2ft1, new_t);
                set_tet_adjacent(new_t, t1ft2, t2);
            }

            // Except for the initial call (see "Special case" above),
            // the nested calls all come from the same location,
            // thus there is only one possible return point
            // (no need to push any return address).
            goto return_point;
        }